

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIPSolution.cpp
# Opt level: O0

double __thiscall BGIPSolution::GetPayoff(BGIPSolution *this)

{
  size_t sVar1;
  shared_ptr<JPPVValuePair> *this_00;
  type pJVar2;
  shared_ptr<PartialJPDPValuePair> *this_01;
  type pPVar3;
  size_type sVar4;
  const_reference this_02;
  size_type sVar5;
  const_reference this_03;
  long in_RDI;
  double in_XMM0_Qa;
  double local_8;
  
  if ((*(byte *)(in_RDI + 0x20) & 1) == 0) {
    sVar4 = std::
            priority_queue<boost::shared_ptr<JPPVValuePair>,_std::vector<boost::shared_ptr<JPPVValuePair>,_std::allocator<boost::shared_ptr<JPPVValuePair>_>_>,_std::less<boost::shared_ptr<JPPVValuePair>_>_>
            ::size((priority_queue<boost::shared_ptr<JPPVValuePair>,_std::vector<boost::shared_ptr<JPPVValuePair>,_std::allocator<boost::shared_ptr<JPPVValuePair>_>_>,_std::less<boost::shared_ptr<JPPVValuePair>_>_>
                    *)0x8d0224);
    if (sVar4 == 0) {
      sVar5 = std::
              priority_queue<boost::shared_ptr<PartialJPDPValuePair>,_std::vector<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>,_std::less<boost::shared_ptr<PartialJPDPValuePair>_>_>
              ::size((priority_queue<boost::shared_ptr<PartialJPDPValuePair>,_std::vector<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>,_std::less<boost::shared_ptr<PartialJPDPValuePair>_>_>
                      *)0x8d025d);
      if (sVar5 == 0) {
        local_8 = -1.79769313486232e+308;
      }
      else {
        this_03 = std::
                  priority_queue<boost::shared_ptr<PartialJPDPValuePair>,_std::vector<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>,_std::less<boost::shared_ptr<PartialJPDPValuePair>_>_>
                  ::top((priority_queue<boost::shared_ptr<PartialJPDPValuePair>,_std::vector<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>,_std::less<boost::shared_ptr<PartialJPDPValuePair>_>_>
                         *)0x8d0270);
        pPVar3 = boost::shared_ptr<PartialJPDPValuePair>::operator->(this_03);
        (*(pPVar3->super_PartialJointPolicyValuePair).super_PartialPolicyPoolItemInterface.
          _vptr_PartialPolicyPoolItemInterface[3])();
        local_8 = in_XMM0_Qa;
      }
    }
    else {
      this_02 = std::
                priority_queue<boost::shared_ptr<JPPVValuePair>,_std::vector<boost::shared_ptr<JPPVValuePair>,_std::allocator<boost::shared_ptr<JPPVValuePair>_>_>,_std::less<boost::shared_ptr<JPPVValuePair>_>_>
                ::top((priority_queue<boost::shared_ptr<JPPVValuePair>,_std::vector<boost::shared_ptr<JPPVValuePair>,_std::allocator<boost::shared_ptr<JPPVValuePair>_>_>,_std::less<boost::shared_ptr<JPPVValuePair>_>_>
                       *)0x8d0237);
      pJVar2 = boost::shared_ptr<JPPVValuePair>::operator->(this_02);
      (*(pJVar2->super_JointPolicyValuePair).super_PolicyPoolItemInterface.
        _vptr_PolicyPoolItemInterface[3])();
      local_8 = in_XMM0_Qa;
    }
  }
  else {
    sVar1 = FixedCapacityPriorityQueue<boost::shared_ptr<JPPVValuePair>,_std::less<boost::shared_ptr<JPPVValuePair>_>_>
            ::size((FixedCapacityPriorityQueue<boost::shared_ptr<JPPVValuePair>,_std::less<boost::shared_ptr<JPPVValuePair>_>_>
                    *)0x8d0199);
    if (sVar1 == 0) {
      sVar1 = FixedCapacityPriorityQueue<boost::shared_ptr<PartialJPDPValuePair>,_std::less<boost::shared_ptr<PartialJPDPValuePair>_>_>
              ::size((FixedCapacityPriorityQueue<boost::shared_ptr<PartialJPDPValuePair>,_std::less<boost::shared_ptr<PartialJPDPValuePair>_>_>
                      *)0x8d01d5);
      if (sVar1 == 0) {
        local_8 = -1.79769313486232e+308;
      }
      else {
        this_01 = FixedCapacityPriorityQueue<boost::shared_ptr<PartialJPDPValuePair>,_std::less<boost::shared_ptr<PartialJPDPValuePair>_>_>
                  ::top((FixedCapacityPriorityQueue<boost::shared_ptr<PartialJPDPValuePair>,_std::less<boost::shared_ptr<PartialJPDPValuePair>_>_>
                         *)0x8d01e8);
        pPVar3 = boost::shared_ptr<PartialJPDPValuePair>::operator->(this_01);
        (*(pPVar3->super_PartialJointPolicyValuePair).super_PartialPolicyPoolItemInterface.
          _vptr_PartialPolicyPoolItemInterface[3])();
        local_8 = in_XMM0_Qa;
      }
    }
    else {
      this_00 = FixedCapacityPriorityQueue<boost::shared_ptr<JPPVValuePair>,_std::less<boost::shared_ptr<JPPVValuePair>_>_>
                ::top((FixedCapacityPriorityQueue<boost::shared_ptr<JPPVValuePair>,_std::less<boost::shared_ptr<JPPVValuePair>_>_>
                       *)0x8d01ac);
      pJVar2 = boost::shared_ptr<JPPVValuePair>::operator->(this_00);
      (*(pJVar2->super_JointPolicyValuePair).super_PolicyPoolItemInterface.
        _vptr_PolicyPoolItemInterface[3])();
      local_8 = in_XMM0_Qa;
    }
  }
  return local_8;
}

Assistant:

double BGIPSolution::GetPayoff() const
{ 
    if(_m_useFixedCapacityPriorityQueue)
    {
        if(_m_qFixedK.size() > 0)
            return(_m_qFixedK.top()->GetValue());
        else if(_m_qpFixedK.size() > 0)
            return(_m_qpFixedK.top()->GetValue());
        else
            return(-DBL_MAX);
    }
    else
    {
        if(_m_qInfSize->size() > 0)
            return(_m_qInfSize->top()->GetValue());
        else if(_m_qpInfSize->size() > 0)
            return(_m_qpInfSize->top()->GetValue());
        else
            return(-DBL_MAX);
    }
}